

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

DescriptorMap * __thiscall
Memory::
AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  size_t byteSize;
  DescriptorMap *local_68;
  size_t count_local;
  AllocFuncType AllocFunc_local;
  Recycler *allocator_local;
  DescriptorMap *local_10;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    local_10 = (DescriptorMap *)0x8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = SUB168(auVar1 * ZEXT816(0x40),0);
    if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
      byteSize = 0xffffffffffffffff;
    }
    local_10 = (DescriptorMap *)
               new__<Memory::Recycler>
                         (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    if (count != 0) {
      local_68 = local_10;
      do {
        Js::JavascriptObject::DefinePropertiesHelperForGenericObjects::DescriptorMap::DescriptorMap
                  (local_68);
        local_68 = local_68 + 1;
      } while (local_68 != local_10 + count);
    }
  }
  return local_10;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}